

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

void Aig_ManDfsReverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  ulong uVar2;
  Aig_Obj_t *pObj_00;
  uint uVar3;
  uint uVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b4,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  uVar2 = *(ulong *)&pObj->field_0x18;
  uVar3 = (uint)uVar2 & 7;
  if ((uVar3 != 4) && (1 < uVar3 - 5)) {
    __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b7,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b8,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  uVar4 = 0;
  uVar3 = 0xffffffff;
  do {
    if (((uint)(uVar2 >> 6) & 0x3ffffff) <= uVar4) {
      if (pObj->TravId != p->nTravIds) {
        pObj->TravId = p->nTravIds;
        Vec_PtrPush(vNodes,pObj);
        return;
      }
      __assert_fail("!Aig_ObjIsTravIdCurrent(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x1ba,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if (uVar4 == 0) {
      if (p->nFansAlloc <= pObj->Id) {
        __assert_fail("ObjId < p->nFansAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
      }
      iVar1 = pObj->Id * 5;
    }
    else {
      if (p->nFansAlloc <= (int)uVar3 / 2) {
        __assert_fail("iFan/2 < p->nFansAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
      }
      iVar1 = ((int)uVar3 >> 1) * 5 + (uVar3 & 1) + 3;
    }
    uVar3 = p->pFanData[iVar1];
    if (p->vObjs == (Vec_Ptr_t *)0x0) {
      pObj_00 = (Aig_Obj_t *)0x0;
    }
    else {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,(int)uVar3 >> 1);
    }
    Aig_ManDfsReverse_rec(p,pObj_00,vNodes);
    uVar4 = uVar4 + 1;
    uVar2 = *(ulong *)&pObj->field_0x18;
  } while( true );
}

Assistant:

void Aig_ManDfsReverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Aig_ManDfsReverse_rec( p, pFanout, vNodes );
    assert( !Aig_ObjIsTravIdCurrent(p, pObj) ); // loop detection
    Aig_ObjSetTravIdCurrent(p, pObj);
    Vec_PtrPush( vNodes, pObj );
}